

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::ImFont(ImFont *this)

{
  ImVector<float> *in_RDI;
  
  ImVector<float>::ImVector(in_RDI);
  ImVector<unsigned_short>::ImVector((ImVector<unsigned_short> *)&in_RDI[1].Data);
  ImVector<ImFontGlyph>::ImVector((ImVector<ImFontGlyph> *)&in_RDI[2].Data);
  in_RDI[1].Capacity = 0;
  in_RDI[1].Size = 0;
  *(undefined2 *)((long)&in_RDI[5].Size + 2) = 0x3f;
  *(undefined2 *)&in_RDI[5].Capacity = 0xffff;
  in_RDI[3].Data = (float *)0x0;
  in_RDI[4].Size = 0;
  in_RDI[4].Capacity = 0;
  in_RDI[4].Data = (float *)0x0;
  *(undefined2 *)&in_RDI[5].Size = 0;
  *(undefined1 *)((long)&in_RDI[5].Capacity + 2) = 0;
  *(undefined4 *)&in_RDI[5].Data = 0x3f800000;
  in_RDI[6].Size = 0;
  *(undefined4 *)((long)&in_RDI[5].Data + 4) = 0;
  in_RDI[6].Capacity = 0;
  memset(&in_RDI[6].Data,0,2);
  return;
}

Assistant:

ImFont::ImFont()
{
    FontSize = 0.0f;
    FallbackAdvanceX = 0.0f;
    FallbackChar = (ImWchar)'?';
    EllipsisChar = (ImWchar)-1;
    FallbackGlyph = NULL;
    ContainerAtlas = NULL;
    ConfigData = NULL;
    ConfigDataCount = 0;
    DirtyLookupTables = false;
    Scale = 1.0f;
    Ascent = Descent = 0.0f;
    MetricsTotalSurface = 0;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
}